

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O3

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<0>::operator()
          (_defaultInitializer<0> *this,CustomData *out,char *param_2)

{
  vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  local_118;
  undefined **local_f8;
  undefined1 local_f0 [8];
  vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  local_e8;
  undefined1 local_d0 [184];
  
  memset(local_f0,0,0xd8);
  (out->super_ElemBase).dna_type = (char *)0x0;
  local_118.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (out->layers).
       super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       .
       super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_118.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (out->layers).
       super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       .
       super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_118.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (out->layers).
       super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       .
       super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (out->layers).
  super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  .
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (out->layers).
  super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  .
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (out->layers).
  super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  .
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ::~vector(&local_118);
  memcpy(out->typemap,local_d0,0xb4);
  local_f8 = &PTR__CustomData_007def68;
  ::std::
  vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ::~vector(&local_e8);
  return;
}

Assistant:

void operator ()(T& out, const char* = NULL) {
            out = T();
        }